

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O3

void __thiscall leveldb::DBImpl::RecordBackgroundError(DBImpl *this,Status *s)

{
  char *pcVar1;
  
  if ((this->bg_error_).state_ != (char *)0x0) {
    return;
  }
  if (s->state_ != (char *)0x0) {
    pcVar1 = Status::CopyState(s->state_);
    (this->bg_error_).state_ = pcVar1;
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

bool ok() const { return (state_ == nullptr); }